

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void __thiscall ImGuiIO::AddMousePosEvent(ImGuiIO *this,float x,float y)

{
  int *piVar1;
  ImGuiInputEvent *pIVar2;
  ImGuiContext *pIVar3;
  int iVar4;
  ImGuiInputEvent *__dest;
  int iVar5;
  int iVar6;
  ImGuiContext *ctx;
  
  pIVar3 = GImGui;
  if (&GImGui->IO == this) {
    if (this->AppAcceptingEvents == true) {
      iVar4 = (GImGui->InputEventsQueue).Size;
      if (iVar4 == (GImGui->InputEventsQueue).Capacity) {
        if (iVar4 == 0) {
          iVar5 = 8;
        }
        else {
          iVar5 = iVar4 / 2 + iVar4;
        }
        iVar6 = iVar4 + 1;
        if (iVar4 + 1 < iVar5) {
          iVar6 = iVar5;
        }
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
        __dest = (ImGuiInputEvent *)
                 (*GImAllocatorAllocFunc)((long)iVar6 * 0x18,GImAllocatorUserData);
        pIVar2 = (pIVar3->InputEventsQueue).Data;
        if (pIVar2 != (ImGuiInputEvent *)0x0) {
          memcpy(__dest,pIVar2,(long)(pIVar3->InputEventsQueue).Size * 0x18);
          pIVar2 = (pIVar3->InputEventsQueue).Data;
          if ((pIVar2 != (ImGuiInputEvent *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar2,GImAllocatorUserData);
        }
        (pIVar3->InputEventsQueue).Data = __dest;
        (pIVar3->InputEventsQueue).Capacity = iVar6;
        iVar4 = (pIVar3->InputEventsQueue).Size;
      }
      else {
        __dest = (GImGui->InputEventsQueue).Data;
      }
      __dest[iVar4].Type = ImGuiInputEventType_MousePos;
      __dest[iVar4].Source = ImGuiInputSource_Mouse;
      __dest[iVar4].field_2.MousePos.PosX = x;
      __dest[iVar4].field_2.MousePos.PosY = y;
      *(undefined8 *)((long)&__dest[iVar4].field_2 + 8) = 0;
      (pIVar3->InputEventsQueue).Size = (pIVar3->InputEventsQueue).Size + 1;
    }
    return;
  }
  __assert_fail("&g.IO == this && \"Can only add events to current context.\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui.cpp"
                ,0x54d,"void ImGuiIO::AddMousePosEvent(float, float)");
}

Assistant:

void ImGuiIO::AddMousePosEvent(float x, float y)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(&g.IO == this && "Can only add events to current context.");
    if (!AppAcceptingEvents)
        return;

    ImGuiInputEvent e;
    e.Type = ImGuiInputEventType_MousePos;
    e.Source = ImGuiInputSource_Mouse;
    e.MousePos.PosX = x;
    e.MousePos.PosY = y;
    g.InputEventsQueue.push_back(e);
}